

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O3

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::InitializePipelineDesc
          (PipelineStateBase<Diligent::EngineGLImplTraits> *this,
          GraphicsPipelineStateCreateInfo *CreateInfo,FixedLinearAllocator *MemPool)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  IRenderPass *pIVar3;
  AttachmentReference *pAVar4;
  LayoutElement *pLVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  int iVar10;
  uint uVar11;
  GraphicsPipelineData *pGVar12;
  RenderDeviceGLImpl *pRVar13;
  undefined4 extraout_var;
  RenderPassBase<Diligent::EngineGLImplTraits> *this_00;
  SubpassDesc *pSVar14;
  LayoutElement *pLayoutElements;
  Char *pCVar15;
  Uint32 *pUVar16;
  size_t sVar17;
  uint uVar18;
  char *in_RCX;
  ulong uVar19;
  char *pcVar20;
  long lVar21;
  AttachmentReference *DSAttachmentRef;
  ulong uVar22;
  string msg;
  string local_58;
  PipelineStateBase<Diligent::EngineGLImplTraits> *local_38;
  
  pGVar12 = FixedLinearAllocator::
            Construct<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::GraphicsPipelineData>
                      (MemPool);
  (this->field_6).m_pGraphicsPipelineData = pGVar12;
  MemPool->m_pAllocator = (IMemoryAllocator *)0x0;
  pGVar12 = (this->field_6).m_pGraphicsPipelineData;
  if ((GraphicsPipelineData *)MemPool->m_pDataStart != pGVar12) {
    FormatString<char[26],char[29]>
              (&local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Ptr == m_pPipelineDataRawMem",(char (*) [29])in_RCX);
    in_RCX = (char *)0x3b7;
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"InitializePipelineDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x3b7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    pGVar12 = (this->field_6).m_pGraphicsPipelineData;
  }
  memcpy(pGVar12,&CreateInfo->GraphicsPipeline,0xbc);
  pRVar13 = DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
            ::GetDevice(&this->
                         super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                       );
  CorrectGraphicsPipelineDesc
            (&pGVar12->Desc,
             &(pRVar13->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Features)
  ;
  CopyResourceLayout(&(CreateInfo->super_PipelineStateCreateInfo).PSODesc.ResourceLayout,
                     &(this->
                      super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                      ).m_Desc.ResourceLayout,MemPool);
  local_38 = this;
  CopyResourceSignatures(this,&CreateInfo->super_PipelineStateCreateInfo,MemPool);
  RefCntAutoPtr<Diligent::IRenderPass>::operator=(&pGVar12->pRenderPass,(pGVar12->Desc).pRenderPass)
  ;
  pIVar3 = (pGVar12->pRenderPass).m_pObject;
  if (pIVar3 != (IRenderPass *)0x0) {
    iVar10 = (*(pIVar3->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    lVar21 = CONCAT44(extraout_var,iVar10);
    if (*(uint *)(lVar21 + 0x18) <= (uint)(pGVar12->Desc).SubpassIndex) {
      FormatString<char[26],char[52]>
                (&local_58,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"GraphicsPipeline.SubpassIndex < RPDesc.SubpassCount",
                 (char (*) [52])in_RCX);
      in_RCX = (char *)0x3c8;
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"InitializePipelineDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    this_00 = &RefCntAutoPtr<Diligent::IRenderPass>::RawPtr<Diligent::RenderPassGLImpl>
                         (&pGVar12->pRenderPass)->super_RenderPassBase<Diligent::EngineGLImplTraits>
    ;
    pSVar14 = RenderPassBase<Diligent::EngineGLImplTraits>::GetSubpass
                        (this_00,(uint)(pGVar12->Desc).SubpassIndex);
    uVar11 = pSVar14->RenderTargetAttachmentCount;
    (pGVar12->Desc).NumRenderTargets = (Uint8)uVar11;
    if (uVar11 != 0) {
      pcVar20 = (char *)0x0;
      do {
        pAVar4 = pSVar14->pRenderTargetAttachments;
        uVar18 = pAVar4[(long)pcVar20].AttachmentIndex;
        if (uVar18 != 0xffffffff) {
          if (*(uint *)(lVar21 + 8) <= uVar18) {
            FormatString<char[26],char[57]>
                      (&local_58,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"RTAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount",
                       (char (*) [57])(ulong)uVar18);
            DebugAssertionFailed
                      (local_58._M_dataplus._M_p,"InitializePipelineDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                       ,0x3d1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            uVar18 = pAVar4[(long)pcVar20].AttachmentIndex;
            uVar11 = pSVar14->RenderTargetAttachmentCount;
          }
          (pGVar12->Desc).RTVFormats[(long)pcVar20] =
               *(TEXTURE_FORMAT *)(*(long *)(lVar21 + 0x10) + (ulong)uVar18 * 0x10);
        }
        pcVar20 = pcVar20 + 1;
        in_RCX = (char *)(ulong)uVar11;
      } while (pcVar20 < in_RCX);
    }
    pAVar4 = pSVar14->pDepthStencilAttachment;
    if ((pAVar4 != (AttachmentReference *)0x0) &&
       (uVar11 = pAVar4->AttachmentIndex, uVar11 != 0xffffffff)) {
      if (*(uint *)(lVar21 + 8) <= uVar11) {
        FormatString<char[26],char[57]>
                  (&local_58,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"DSAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount",
                   (char (*) [57])in_RCX);
        DebugAssertionFailed
                  (local_58._M_dataplus._M_p,"InitializePipelineDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                   ,0x3db);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        uVar11 = pAVar4->AttachmentIndex;
      }
      in_RCX = *(char **)(lVar21 + 0x10);
      (pGVar12->Desc).DSVFormat = *(TEXTURE_FORMAT *)(*(char (*) [57])in_RCX + (ulong)uVar11 * 0x10)
      ;
    }
  }
  uVar22 = (ulong)(pGVar12->Desc).InputLayout.NumElements;
  uVar11 = 0;
  if (uVar22 == 0) {
    pLayoutElements = (LayoutElement *)0x0;
  }
  else {
    pLayoutElements = FixedLinearAllocator::ConstructArray<Diligent::LayoutElement>(MemPool,uVar22);
    if ((pGVar12->Desc).InputLayout.NumElements != 0) {
      lVar21 = 0;
      uVar22 = 0;
      do {
        pLVar5 = (pGVar12->Desc).InputLayout.LayoutElements;
        *(undefined8 *)(&pLayoutElements->Frequency + lVar21) =
             *(undefined8 *)(&pLVar5->Frequency + lVar21);
        puVar1 = (undefined8 *)((long)&pLVar5->HLSLSemantic + lVar21);
        uVar6 = *puVar1;
        uVar7 = puVar1[1];
        puVar1 = (undefined8 *)((long)&pLVar5->NumComponents + lVar21);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pLayoutElements->NumComponents + lVar21);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar1 = (undefined8 *)((long)&pLayoutElements->HLSLSemantic + lVar21);
        *puVar1 = uVar6;
        puVar1[1] = uVar7;
        pcVar20 = *(char **)((long)&pLVar5->HLSLSemantic + lVar21);
        if (pcVar20 == (char *)0x0) {
          FormatString<char[26],char[32]>
                    (&local_58,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"SrcElem.HLSLSemantic != nullptr",(char (*) [32])in_RCX);
          in_RCX = (char *)0x3ea;
          DebugAssertionFailed
                    (local_58._M_dataplus._M_p,"InitializePipelineDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                     ,0x3ea);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          pcVar20 = *(char **)((long)&pLVar5->HLSLSemantic + lVar21);
        }
        pCVar15 = FixedLinearAllocator::CopyString(MemPool,pcVar20,0);
        *(Char **)((long)&pLayoutElements->HLSLSemantic + lVar21) = pCVar15;
        uVar22 = uVar22 + 1;
        uVar11 = (pGVar12->Desc).InputLayout.NumElements;
        lVar21 = lVar21 + 0x28;
      } while (uVar22 < uVar11);
    }
    ResolveInputLayoutAutoOffsetsAndStrides
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,pLayoutElements,
               uVar11);
    _Var9._M_p = local_58._M_dataplus._M_p;
    uVar22 = local_58._M_string_length - (long)local_58._M_dataplus._M_p >> 2;
    pGVar12->BufferSlotsUsed = (Uint8)uVar22;
    uVar22 = uVar22 & 0xff;
    pUVar16 = (Uint32 *)FixedLinearAllocator::Allocate(MemPool,(ulong)(uint)((int)uVar22 * 4),4);
    if (uVar22 != 0) {
      uVar19 = 0;
      do {
        pUVar16[uVar19] = *(Uint32 *)(_Var9._M_p + uVar19 * 4);
        uVar19 = uVar19 + 1;
      } while (uVar22 != uVar19);
    }
    pGVar12->pStrides = pUVar16;
    if (local_58._M_dataplus._M_p != (Char *)0x0) {
      operator_delete(local_58._M_dataplus._M_p,
                      local_58.field_2._M_allocated_capacity - (long)local_58._M_dataplus._M_p);
    }
  }
  (pGVar12->Desc).InputLayout.LayoutElements = pLayoutElements;
  sVar17 = ComputeRenderTargetFormatsHash
                     ((uint)(pGVar12->Desc).NumRenderTargets,(pGVar12->Desc).RTVFormats,
                      (pGVar12->Desc).DSVFormat);
  ((local_38->field_6).m_pGraphicsPipelineData)->dvpRenderTargetFormatsHash = sVar17;
  return;
}

Assistant:

void InitializePipelineDesc(const GraphicsPipelineStateCreateInfo& CreateInfo,
                                FixedLinearAllocator&                  MemPool)
    {
        this->m_pGraphicsPipelineData = MemPool.Construct<GraphicsPipelineData>();
        void* Ptr                     = MemPool.ReleaseOwnership();
        VERIFY_EXPR(Ptr == m_pPipelineDataRawMem);

        GraphicsPipelineDesc&       GraphicsPipeline = this->m_pGraphicsPipelineData->Desc;
        RefCntAutoPtr<IRenderPass>& pRenderPass      = this->m_pGraphicsPipelineData->pRenderPass;
        Uint8&                      BufferSlotsUsed  = this->m_pGraphicsPipelineData->BufferSlotsUsed;
        Uint32*&                    pStrides         = this->m_pGraphicsPipelineData->pStrides;

        GraphicsPipeline = CreateInfo.GraphicsPipeline;
        CorrectGraphicsPipelineDesc(GraphicsPipeline, this->GetDevice()->GetDeviceInfo().Features);

        CopyResourceLayout(CreateInfo.PSODesc.ResourceLayout, this->m_Desc.ResourceLayout, MemPool);
        CopyResourceSignatures(CreateInfo, MemPool);

        pRenderPass = GraphicsPipeline.pRenderPass;
        if (pRenderPass)
        {
            const RenderPassDesc& RPDesc = pRenderPass->GetDesc();
            VERIFY_EXPR(GraphicsPipeline.SubpassIndex < RPDesc.SubpassCount);
            const SubpassDesc& Subpass = pRenderPass.template RawPtr<RenderPassImplType>()->GetSubpass(GraphicsPipeline.SubpassIndex);

            GraphicsPipeline.NumRenderTargets = static_cast<Uint8>(Subpass.RenderTargetAttachmentCount);
            for (Uint32 rt = 0; rt < Subpass.RenderTargetAttachmentCount; ++rt)
            {
                const AttachmentReference& RTAttachmentRef = Subpass.pRenderTargetAttachments[rt];
                if (RTAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
                {
                    VERIFY_EXPR(RTAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount);
                    GraphicsPipeline.RTVFormats[rt] = RPDesc.pAttachments[RTAttachmentRef.AttachmentIndex].Format;
                }
            }

            if (Subpass.pDepthStencilAttachment != nullptr)
            {
                const AttachmentReference& DSAttachmentRef = *Subpass.pDepthStencilAttachment;
                if (DSAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
                {
                    VERIFY_EXPR(DSAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount);
                    GraphicsPipeline.DSVFormat = RPDesc.pAttachments[DSAttachmentRef.AttachmentIndex].Format;
                }
            }
        }

        const InputLayoutDesc& InputLayout     = GraphicsPipeline.InputLayout;
        LayoutElement*         pLayoutElements = nullptr;
        if (InputLayout.NumElements > 0)
        {
            pLayoutElements = MemPool.ConstructArray<LayoutElement>(InputLayout.NumElements);
            for (size_t Elem = 0; Elem < InputLayout.NumElements; ++Elem)
            {
                const LayoutElement& SrcElem = InputLayout.LayoutElements[Elem];
                pLayoutElements[Elem]        = SrcElem;
                VERIFY_EXPR(SrcElem.HLSLSemantic != nullptr);
                pLayoutElements[Elem].HLSLSemantic = MemPool.CopyString(SrcElem.HLSLSemantic);
            }

            // Correct description and compute offsets and tight strides
            const std::vector<Uint32> Strides = ResolveInputLayoutAutoOffsetsAndStrides(pLayoutElements, InputLayout.NumElements);
            BufferSlotsUsed                   = static_cast<Uint8>(Strides.size());

            pStrides = MemPool.CopyConstructArray<Uint32>(Strides.data(), BufferSlotsUsed);
        }
        GraphicsPipeline.InputLayout.LayoutElements = pLayoutElements;

#ifdef DILIGENT_DEVELOPMENT
        this->m_pGraphicsPipelineData->dvpRenderTargetFormatsHash = ComputeRenderTargetFormatsHash(
            GraphicsPipeline.NumRenderTargets, GraphicsPipeline.RTVFormats, GraphicsPipeline.DSVFormat);
#endif
    }